

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatingCodec.cc
# Opt level: O2

void __thiscall
avro::parsing::ValidatingEncoder<avro::parsing::SimpleParser<avro::parsing::DummyHandler>_>::
startItem(ValidatingEncoder<avro::parsing::SimpleParser<avro::parsing::DummyHandler>_> *this)

{
  _Elt_pointer pSVar1;
  Exception *this_00;
  allocator<char> local_39;
  string local_38;
  
  pSVar1 = (this->parser_).parsingStack.c.
           super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pSVar1 == (this->parser_).parsingStack.c.
                super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_first) {
    pSVar1 = (this->parser_).parsingStack.c.
             super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
  }
  if (pSVar1[-1].kind_ == sRepeater) {
    (*((this->base_).px)->_vptr_Encoder[0x13])();
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"startItem at not an item boundary",&local_39);
  Exception::Exception(this_00,&local_38);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

size_t handle(const Symbol& s) {
        return 0;
    }